

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O2

int saslclientio_close_async
              (CONCRETE_IO_HANDLE sasl_client_io,ON_IO_CLOSE_COMPLETE on_io_close_complete,
              void *on_io_close_complete_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (sasl_client_io == (CONCRETE_IO_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x45f;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x45f;
    }
    pcVar4 = "NULL saslclientio_close";
    iVar3 = 0x45e;
  }
  else if ((*(uint *)((long)sasl_client_io + 0x68) & 0xfffffffb) == 0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x46b;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x46b;
    }
    pcVar4 = "saslclientio_close called while not open";
    iVar3 = 0x46a;
  }
  else {
    *(undefined4 *)((long)sasl_client_io + 0x68) = 4;
    *(ON_IO_CLOSE_COMPLETE *)((long)sasl_client_io + 0x18) = on_io_close_complete;
    *(void **)((long)sasl_client_io + 0x38) = on_io_close_complete_context;
    iVar1 = xio_close(*sasl_client_io,on_underlying_io_close_complete,sasl_client_io);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x479;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x479;
    }
    pcVar4 = "xio_close failed";
    iVar3 = 0x478;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
            ,"saslclientio_close_async",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int saslclientio_close_async(CONCRETE_IO_HANDLE sasl_client_io, ON_IO_CLOSE_COMPLETE on_io_close_complete, void* on_io_close_complete_context)
{
    int result = 0;

    /* Codes_SRS_SASLCLIENTIO_01_017: [If `sasl_client_io` is NULL, `saslclientio_close_async` shall fail and return a non-zero value.] */
    if (sasl_client_io == NULL)
    {
        LogError("NULL saslclientio_close");
        result = MU_FAILURE;
    }
    else
    {
        SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance = (SASL_CLIENT_IO_INSTANCE*)sasl_client_io;

        /* Codes_SRS_SASLCLIENTIO_01_098: [`saslclientio_close_async` shall only perform the close if the state is OPEN, OPENING or ERROR.] */
        if ((sasl_client_io_instance->io_state == IO_STATE_NOT_OPEN) ||
            (sasl_client_io_instance->io_state == IO_STATE_CLOSING))
        {
            /* Codes_SRS_SASLCLIENTIO_01_097: [If `saslclientio_close_async` is called when the IO is in the `IO_STATE_NOT_OPEN` state, `saslclientio_close_async` shall fail and return a non zero value.] */
            LogError("saslclientio_close called while not open");
            result = MU_FAILURE;
        }
        else
        {
            sasl_client_io_instance->io_state = IO_STATE_CLOSING;

            sasl_client_io_instance->on_io_close_complete = on_io_close_complete;
            sasl_client_io_instance->on_io_close_complete_context = on_io_close_complete_context;

            /* Codes_SRS_SASLCLIENTIO_01_015: [`saslclientio_close_async` shall close the underlying io handle passed in `saslclientio_create` by calling `xio_close`.] */
            if (xio_close(sasl_client_io_instance->underlying_io, on_underlying_io_close_complete, sasl_client_io_instance) != 0)
            {
                /* Codes_SRS_SASLCLIENTIO_01_018: [If `xio_close` fails, then `saslclientio_close_async` shall return a non-zero value.] */
                LogError("xio_close failed");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_SASLCLIENTIO_01_016: [On success, `saslclientio_close_async` shall return 0.] */
                result = 0;
            }
        }
    }

    return result;
}